

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O0

void al_use_projection_transform(ALLEGRO_TRANSFORM *trans)

{
  uint uVar1;
  ALLEGRO_BITMAP *bitmap;
  ALLEGRO_DISPLAY *pAVar2;
  undefined1 *in_RDI;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_BITMAP *target;
  ALLEGRO_TRANSFORM *in_stack_ffffffffffffffe8;
  
  bitmap = al_get_target_bitmap();
  if ((bitmap != (ALLEGRO_BITMAP *)0x0) && (uVar1 = al_get_bitmap_flags(bitmap), (uVar1 & 1) == 0))
  {
    if ((ALLEGRO_TRANSFORM *)in_RDI != &bitmap->transform) {
      al_copy_transform((ALLEGRO_TRANSFORM *)bitmap,in_stack_ffffffffffffffe8);
    }
    pAVar2 = _al_get_bitmap_display(bitmap);
    if (pAVar2 != (ALLEGRO_DISPLAY *)0x0) {
      (*pAVar2->vt->update_transformation)(pAVar2,bitmap);
    }
  }
  return;
}

Assistant:

void al_use_projection_transform(const ALLEGRO_TRANSFORM *trans)
{
   ALLEGRO_BITMAP *target = al_get_target_bitmap();
   ALLEGRO_DISPLAY *display;

   if (!target)
      return;

   /* Memory bitmaps don't support custom projection transforms */
   if (al_get_bitmap_flags(target) & ALLEGRO_MEMORY_BITMAP)
      return;

   /* Changes to a back buffer should affect the front buffer, and vice versa.
    * Currently we rely on the fact that in the OpenGL drivers the back buffer
    * and front buffer bitmaps are exactly the same, and the DirectX driver
    * doesn't support front buffer bitmaps.
    */

   if (trans != &target->transform) {
      al_copy_transform(&target->proj_transform, trans);
   }

   display = _al_get_bitmap_display(target);
   if (display) {
      display->vt->update_transformation(display, target);
   }
}